

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.c
# Opt level: O1

ZyanStatus
ZyanStringAppendDecS
          (ZyanString *string,ZyanI64 value,ZyanU8 padding_length,ZyanBool force_sign,
          ZyanStringView *prefix)

{
  ZyanStatus ZVar1;
  
  if (value < 0) {
    ZVar1 = ZyanStringAppend(string,&STR_SUB);
    if ((-1 < (int)ZVar1) &&
       ((prefix == (ZyanStringView *)0x0 ||
        (ZVar1 = ZyanStringAppend(string,prefix), -1 < (int)ZVar1)))) {
      value = -value;
      goto LAB_0011e681;
    }
  }
  else if (((force_sign == '\0') || (ZVar1 = ZyanStringAppend(string,&STR_ADD), -1 < (int)ZVar1)) &&
          ((prefix == (ZyanStringView *)0x0 ||
           (ZVar1 = ZyanStringAppend(string,prefix), -1 < (int)ZVar1)))) {
LAB_0011e681:
    ZVar1 = ZyanStringAppendDecU64(string,value,padding_length);
    return ZVar1;
  }
  return ZVar1;
}

Assistant:

ZyanStatus ZyanStringAppendDecS(ZyanString* string, ZyanI64 value, ZyanU8 padding_length,
    ZyanBool force_sign, const ZyanStringView* prefix)
{
    if (value < 0)
    {
        ZYAN_CHECK(ZyanStringAppend(string, &STR_SUB));
        if (prefix)
        {
            ZYAN_CHECK(ZyanStringAppend(string, prefix));
        }
        return ZyanStringAppendDecU(string, ZyanAbsI64(value), padding_length);
    }

    if (force_sign)
    {
        ZYAN_ASSERT(value >= 0);
        ZYAN_CHECK(ZyanStringAppend(string, &STR_ADD));
    }

    if (prefix)
    {
        ZYAN_CHECK(ZyanStringAppend(string, prefix));
    }
    return ZyanStringAppendDecU(string, value, padding_length);
}